

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::LoopGenerateSyntax::getChild(LoopGenerateSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  Token token_04;
  Token token_05;
  Token token_06;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff38;
  Info *in_stack_ffffffffffffff40;
  nullptr_t in_stack_ffffffffffffff48;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x18),in_stack_ffffffffffffff38);
    break;
  case 1:
    token.info = in_stack_ffffffffffffff40;
    token._0_8_ = in_stack_ffffffffffffff38;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x9c014e,token);
    break;
  case 2:
    token_00.info = in_stack_ffffffffffffff40;
    token_00._0_8_ = in_stack_ffffffffffffff38;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x9c018a,token_00);
    break;
  case 3:
    token_01.info = in_stack_ffffffffffffff40;
    token_01._0_8_ = in_stack_ffffffffffffff38;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x9c01c6,token_01);
    break;
  case 4:
    token_02.info = in_stack_ffffffffffffff40;
    token_02._0_8_ = in_stack_ffffffffffffff38;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x9c0202,token_02);
    break;
  case 5:
    token_03.info = in_stack_ffffffffffffff40;
    token_03._0_8_ = in_stack_ffffffffffffff38;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x9c0238,token_03);
    break;
  case 6:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 0xa0));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    break;
  case 7:
    token_04.info = in_stack_ffffffffffffff40;
    token_04._0_8_ = in_stack_ffffffffffffff38;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x9c0291,token_04);
    break;
  case 8:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 0xb8));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    break;
  case 9:
    token_05.info = in_stack_ffffffffffffff40;
    token_05._0_8_ = in_stack_ffffffffffffff38;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x9c02ea,token_05);
    break;
  case 10:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 0xd0));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    break;
  case 0xb:
    token_06.info = in_stack_ffffffffffffff40;
    token_06._0_8_ = in_stack_ffffffffffffff38;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x9c0340,token_06);
    break;
  case 0xc:
    not_null<slang::syntax::MemberSyntax_*>::get
              ((not_null<slang::syntax::MemberSyntax_*> *)(in_RSI + 0xe8));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffff48);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax LoopGenerateSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return openParen;
        case 3: return genvar;
        case 4: return identifier;
        case 5: return equals;
        case 6: return initialExpr.get();
        case 7: return semi1;
        case 8: return stopExpr.get();
        case 9: return semi2;
        case 10: return iterationExpr.get();
        case 11: return closeParen;
        case 12: return block.get();
        default: return nullptr;
    }
}